

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *this_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string requiredVersion;
  string local_70;
  char *local_50;
  long local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  
  local_40 = 0x332e31;
  local_48 = 3;
  local_50 = (char *)&local_40;
  iVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x44])();
  paVar1 = &local_70.field_2;
  if ((char)iVar3 != '\0') {
    local_70.field_2._M_allocated_capacity._0_4_ = 0x352e31;
    local_70._M_string_length = 3;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                               local_70.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  bVar2 = cmGlobalNinjaGenerator::SupportsManifestRestat
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  if (bVar2) {
    bVar2 = cmake::DoWriteGlobVerifyTarget
                      (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)
                       ->CMakeInstance);
    if (bVar2) {
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"CMAKE_SUPPRESS_REGENERATION","");
      bVar2 = cmGlobalGenerator::GlobalSettingIsOn(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                 local_70.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (!bVar2) {
        local_70.field_2._M_allocated_capacity._0_4_ = 0x382e31;
        local_70._M_string_length = 3;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                   local_70.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Minimal version of Ninja required by this file","");
  cmGlobalNinjaGenerator::WriteComment(os,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                             local_70.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"ninja_required_version = ",0x19);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  if (local_50 != (char *)&local_40) {
    operator_delete(local_50,CONCAT44(uStack_3c,local_40) + 1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  std::string requiredVersion = cmGlobalNinjaGenerator::RequiredNinjaVersion();

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  if (this->GetGlobalNinjaGenerator()->SupportsDirectConsole()) {
    requiredVersion =
      cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool();
  }

  // The Ninja generator writes rules which require support for restat
  // when rebuilding build.ninja manifest (>= 1.8)
  if (this->GetGlobalNinjaGenerator()->SupportsManifestRestat() &&
      this->GetCMakeInstance()->DoWriteGlobVerifyTarget() &&
      !this->GetGlobalNinjaGenerator()->GlobalSettingIsOn(
        "CMAKE_SUPPRESS_REGENERATION")) {
    requiredVersion =
      cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat();
  }

  cmGlobalNinjaGenerator::WriteComment(
    os, "Minimal version of Ninja required by this file");
  os << "ninja_required_version = " << requiredVersion << "\n\n";
}